

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

string * __thiscall
soul::Type::getShortIdentifierDescription_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  bool bVar1;
  BoundedIntSize BVar2;
  ArraySize AVar3;
  Structure *this_00;
  string *__rhs;
  char *pcVar4;
  allocator<char> local_20a;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  Type local_1c8;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  Type local_130;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Type local_98;
  string local_80;
  Type local_50;
  string local_38;
  Type *local_18;
  Type *this_local;
  
  local_18 = this;
  this_local = (Type *)__return_storage_ptr__;
  bVar1 = isConst(this);
  if (bVar1) {
    removeConst(&local_50,this);
    getShortIdentifierDescription_abi_cxx11_(&local_38,&local_50);
    std::operator+(__return_storage_ptr__,"const_",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    ~Type(&local_50);
  }
  else {
    bVar1 = isReference(this);
    if (bVar1) {
      removeReference(&local_98,this);
      getShortIdentifierDescription_abi_cxx11_(&local_80,&local_98);
      std::operator+(__return_storage_ptr__,"ref_",&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      ~Type(&local_98);
    }
    else {
      bVar1 = isVector(this);
      if (bVar1) {
        AVar3 = getVectorSize(this);
        std::__cxx11::to_string(&local_f8,AVar3);
        std::operator+(&local_d8,"vec_",&local_f8);
        std::operator+(&local_b8,&local_d8,"_");
        pcVar4 = PrimitiveType::getShortIdentifierDescription(&this->primitiveType);
        std::operator+(__return_storage_ptr__,&local_b8,pcVar4);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      else {
        bVar1 = isUnsizedArray(this);
        if (bVar1) {
          getArrayElementType(&local_130,this);
          getShortIdentifierDescription_abi_cxx11_(&local_118,&local_130);
          std::operator+(__return_storage_ptr__,"slice_",&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          ~Type(&local_130);
        }
        else {
          bVar1 = isArray(this);
          if (bVar1) {
            AVar3 = getArraySize(this);
            std::__cxx11::to_string(&local_190,AVar3);
            std::operator+(&local_170,"arr_",&local_190);
            std::operator+(&local_150,&local_170,"_");
            getArrayElementType(&local_1c8,this);
            getShortIdentifierDescription_abi_cxx11_(&local_1b0,&local_1c8);
            std::operator+(__return_storage_ptr__,&local_150,&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            ~Type(&local_1c8);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
          }
          else {
            bVar1 = isWrapped(this);
            if (bVar1) {
              BVar2 = getBoundedIntLimit(this);
              std::__cxx11::to_string(&local_1e8,BVar2);
              std::operator+(__return_storage_ptr__,"wrap_",&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
            }
            else {
              bVar1 = isClamped(this);
              if (bVar1) {
                BVar2 = getBoundedIntLimit(this);
                std::__cxx11::to_string(&local_208,BVar2);
                std::operator+(__return_storage_ptr__,"clamp_",&local_208);
                std::__cxx11::string::~string((string *)&local_208);
              }
              else {
                bVar1 = isStruct(this);
                if (bVar1) {
                  this_00 = getStructRef(this);
                  __rhs = Structure::getName_abi_cxx11_(this_00);
                  std::operator+(__return_storage_ptr__,"struct_",__rhs);
                }
                else {
                  bVar1 = isStringLiteral(this);
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"string",&local_209);
                    std::allocator<char>::~allocator(&local_209);
                  }
                  else {
                    pcVar4 = PrimitiveType::getShortIdentifierDescription(&this->primitiveType);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,pcVar4,&local_20a);
                    std::allocator<char>::~allocator(&local_20a);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getShortIdentifierDescription() const
{
    if (isConst())          return "const_" + removeConst().getShortIdentifierDescription();
    if (isReference())      return "ref_" + removeReference().getShortIdentifierDescription();
    if (isVector())         return "vec_" + std::to_string (getVectorSize()) + "_" + primitiveType.getShortIdentifierDescription();
    if (isUnsizedArray())   return "slice_" + getArrayElementType().getShortIdentifierDescription();
    if (isArray())          return "arr_" + std::to_string (getArraySize()) + "_" + getArrayElementType().getShortIdentifierDescription();
    if (isWrapped())        return "wrap_" + std::to_string (getBoundedIntLimit());
    if (isClamped())        return "clamp_" + std::to_string (getBoundedIntLimit());
    if (isStruct())         return "struct_" + getStructRef().getName();
    if (isStringLiteral())  return "string";

    return primitiveType.getShortIdentifierDescription();
}